

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RationalTangentialThinPrismDistortion::RationalTangentialThinPrismDistortion
          (RationalTangentialThinPrismDistortion *this,Properties *prop,int id)

{
  Distortion *in_RDI;
  char *in_stack_00000048;
  double *in_stack_00000050;
  char *in_stack_00000058;
  Properties *in_stack_00000060;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [28];
  int in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  string local_38 [56];
  
  Distortion::Distortion(in_RDI);
  in_RDI->_vptr_Distortion = (_func_int **)&PTR__RationalTangentialThinPrismDistortion_00146968;
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_88);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_a8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_c8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_e8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_108);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_128);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_148);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_168);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_188);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_1a8);
  return;
}

Assistant:

RationalTangentialThinPrismDistortion::RationalTangentialThinPrismDistortion(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("p1", id).c_str(), kd[0], "0");
  prop.getValue(getCameraKey("p2", id).c_str(), kd[1], "0");

  prop.getValue(getCameraKey("k1", id).c_str(), kd[2], "0");
  prop.getValue(getCameraKey("k2", id).c_str(), kd[3], "0");
  prop.getValue(getCameraKey("k3", id).c_str(), kd[4], "0");
  prop.getValue(getCameraKey("k4", id).c_str(), kd[5], "0");
  prop.getValue(getCameraKey("k5", id).c_str(), kd[6], "0");
  prop.getValue(getCameraKey("k6", id).c_str(), kd[7], "0");

  prop.getValue(getCameraKey("s1", id).c_str(), kd[8], "0");
  prop.getValue(getCameraKey("s2", id).c_str(), kd[9], "0");
  prop.getValue(getCameraKey("s3", id).c_str(), kd[10], "0");
  prop.getValue(getCameraKey("s4", id).c_str(), kd[11], "0");
}